

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

cmStateSnapshot * __thiscall
cmState::CreateFunctionCallSnapshot
          (cmStateSnapshot *__return_storage_ptr__,cmState *this,cmStateSnapshot *originSnapshot,
          string *fileName)

{
  PositionType *this_00;
  cmLinkedTree<cmDefinitions> *pcVar1;
  PositionType PVar2;
  iterator it;
  PositionType PVar3;
  PositionType PVar4;
  bool bVar5;
  ReferenceType __src;
  PointerType pSVar6;
  PointerType pBVar7;
  PointerType pSVar8;
  iterator iVar9;
  iterator iVar10;
  PositionType pos;
  iterator local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [208];
  SnapshotDataType local_100;
  
  this_00 = &originSnapshot->Position;
  it.Tree = (originSnapshot->Position).Tree;
  it.Position = (originSnapshot->Position).Position;
  __src = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator*(this_00);
  memcpy(local_1d0,__src,0xd0);
  memcpy(&local_100,local_1d0,0xd0);
  local_200 = cmLinkedTree<cmStateDetail::SnapshotDataType>::Push_impl
                        (&this->SnapshotData,it,&local_100);
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_200);
  PVar3 = (originSnapshot->Position).Position;
  (pSVar6->ScopeParent).Tree = (originSnapshot->Position).Tree;
  (pSVar6->ScopeParent).Position = PVar3;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_200);
  pSVar6->SnapshotType = FunctionCallType;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_200);
  pSVar6->Keep = false;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  iVar9 = pSVar6->ExecutionListFile;
  std::__cxx11::string::string((string *)&local_1f0,(string *)fileName);
  iVar9 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Push_impl(&this->ExecutionListFiles,iVar9,&local_1f0);
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_200);
  pSVar6->ExecutionListFile = iVar9;
  std::__cxx11::string::~string((string *)&local_1f0);
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_200);
  pBVar7 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar6->BuildSystemDirectory);
  (pBVar7->DirectoryEnd).Tree = local_200.Tree;
  (pBVar7->DirectoryEnd).Position = local_200.Position;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  pSVar8 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_200);
  PVar4 = (pSVar6->Policies).Position;
  (pSVar8->PolicyScope).Tree = (pSVar6->Policies).Tree;
  (pSVar8->PolicyScope).Position = PVar4;
  pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
  bVar5 = cmLinkedTree<cmDefinitions>::iterator::IsValid(&pSVar6->Vars);
  if (bVar5) {
    pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(this_00);
    pcVar1 = (pSVar6->Vars).Tree;
    PVar2 = (pSVar6->Vars).Position;
    iVar10 = pSVar6->Vars;
    pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_200);
    (pSVar6->Parent).Tree = pcVar1;
    (pSVar6->Parent).Position = PVar2;
    iVar10 = cmLinkedTree<cmDefinitions>::Push(&this->VarTree,iVar10);
    pSVar6 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_200);
    pSVar6->Vars = iVar10;
    cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,local_200);
    return __return_storage_ptr__;
  }
  __assert_fail("originSnapshot.Position->Vars.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmState.cxx"
                ,0x30f,
                "cmStateSnapshot cmState::CreateFunctionCallSnapshot(const cmStateSnapshot &, const std::string &)"
               );
}

Assistant:

cmStateSnapshot cmState::CreateFunctionCallSnapshot(
  cmStateSnapshot const& originSnapshot, std::string const& fileName)
{
  cmStateDetail::PositionType pos =
    this->SnapshotData.Push(originSnapshot.Position, *originSnapshot.Position);
  pos->ScopeParent = originSnapshot.Position;
  pos->SnapshotType = cmStateEnums::FunctionCallType;
  pos->Keep = false;
  pos->ExecutionListFile = this->ExecutionListFiles.Push(
    originSnapshot.Position->ExecutionListFile, fileName);
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  assert(originSnapshot.Position->Vars.IsValid());
  cmLinkedTree<cmDefinitions>::iterator origin = originSnapshot.Position->Vars;
  pos->Parent = origin;
  pos->Vars = this->VarTree.Push(origin);
  return cmStateSnapshot(this, pos);
}